

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlookup.cpp
# Opt level: O0

void __thiscall CVmObjWeakRefLookupTable::remove_stale_weak_refs(CVmObjWeakRefLookupTable *this)

{
  CVmObjTable *pCVar1;
  int iVar2;
  vm_lookup_ext *pvVar3;
  vm_lookup_val *in_RDI;
  vm_lookup_val *nxt;
  vm_lookup_val *prv;
  vm_lookup_val *entry;
  uint hashval;
  uint i;
  vm_lookup_val **bucket;
  CVmObjTable *pCVar4;
  vm_val_t *in_stack_ffffffffffffffd8;
  CVmObjTable *entry_00;
  CVmObjTable *in_stack_ffffffffffffffe0;
  CVmObjTable *this_00;
  uint local_14;
  vm_lookup_val **local_10;
  
  CVmObjLookupTable::get_ext((CVmObjLookupTable *)in_RDI);
  iVar2 = CVmObjTable::is_obj_deletable(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  if (iVar2 != 0) {
    pvVar3 = CVmObjLookupTable::get_ext((CVmObjLookupTable *)in_RDI);
    vm_val_t::set_nil(&pvVar3->default_value);
  }
  pvVar3 = CVmObjLookupTable::get_ext((CVmObjLookupTable *)in_RDI);
  local_10 = pvVar3->buckets;
  for (local_14 = CVmObjLookupTable::get_bucket_count((CVmObjLookupTable *)0x36afe7); local_14 != 0;
      local_14 = local_14 - 1) {
    pCVar1 = (CVmObjTable *)0x0;
    pCVar4 = (CVmObjTable *)*local_10;
    while (this_00 = pCVar4, entry_00 = pCVar1, this_00 != (CVmObjTable *)0x0) {
      pCVar4 = (CVmObjTable *)this_00->page_slots_;
      iVar2 = CVmObjTable::is_obj_deletable(this_00,(vm_val_t *)entry_00);
      pCVar1 = this_00;
      if (iVar2 != 0) {
        CVmObjLookupTable::unlink_entry
                  ((CVmObjLookupTable *)this_00,(vm_lookup_val *)entry_00,
                   (uint)((ulong)pCVar4 >> 0x20),in_RDI);
        pCVar1 = entry_00;
      }
    }
    local_10 = local_10 + 1;
  }
  return;
}

Assistant:

void CVmObjWeakRefLookupTable::remove_stale_weak_refs(VMG0_)
{
    vm_lookup_val **bucket;
    uint i;
    uint hashval;

    /* remove the default value if it's gone stale */
    if (G_obj_table->is_obj_deletable(&get_ext()->default_value))
        get_ext()->default_value.set_nil();

    /* run through each bucket */
    for (hashval = 0, bucket = get_ext()->buckets, i = get_bucket_count() ;
         i != 0 ; ++bucket, --i, ++hashval)
    {
        vm_lookup_val *entry;
        vm_lookup_val *prv;
        vm_lookup_val *nxt;

        /* run through all entries attached to this bucket */
        for (prv = 0, entry = *bucket ; entry != 0 ; entry = nxt)
        {
            /* remember the next entry, in case we delete this one */
            nxt = entry->nxt;

            /* 
             *   if the value has an object reference that has become stale,
             *   delete the entry 
             */
            if (G_obj_table->is_obj_deletable(&entry->val))
            {
                /* it's deletable, so delete the entire record */
                unlink_entry(vmg_ entry, hashval, prv);

                /* 
                 *   note that we do NOT advance the prv pointer - we've
                 *   deleted this entry, so the one preceding it is now the
                 *   previous for the one following this one 
                 */
            }
            else
            {
                /* we're keeping this entry - make it the new previous */
                prv = entry;
            }
        }
    }
}